

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

void __thiscall o3dgc::Adaptive_Data_Model::update(Adaptive_Data_Model *this,bool from_encoder)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar1 = this->total_count + this->update_cycle;
  this->total_count = uVar1;
  if ((0x8000 < uVar1) && (this->total_count = 0, this->data_symbols != 0)) {
    uVar4 = 0;
    do {
      uVar1 = this->symbol_count[uVar4] + 1 >> 1;
      this->symbol_count[uVar4] = uVar1;
      this->total_count = this->total_count + uVar1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->data_symbols);
  }
  if (this->total_count == 0) {
    __assert_fail("total_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/Open3DGC/o3dgcArithmeticCodec.cpp"
                  ,0x337,"void o3dgc::Adaptive_Data_Model::update(bool)");
  }
  iVar2 = (int)(0x80000000 / (ulong)this->total_count);
  if ((from_encoder) || (this->table_size == 0)) {
    if (this->data_symbols != 0) {
      uVar4 = 0;
      iVar6 = 0;
      do {
        this->distribution[uVar4] = (uint)(iVar6 * iVar2) >> 0x10;
        iVar6 = iVar6 + this->symbol_count[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->data_symbols);
    }
  }
  else {
    if (this->decoder_table == (uint *)0x0) {
      __assert_fail("decoder_table",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/Open3DGC/o3dgcArithmeticCodec.cpp"
                    ,0x342,"void o3dgc::Adaptive_Data_Model::update(bool)");
    }
    if (this->data_symbols == 0) {
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      iVar6 = 0;
      uVar4 = 0;
      do {
        this->distribution[uVar5] = (uint)(iVar6 * iVar2) >> 0x10;
        iVar6 = iVar6 + this->symbol_count[uVar5];
        uVar1 = this->distribution[uVar5] >> ((byte)this->table_shift & 0x1f);
        if ((uint)uVar4 < uVar1) {
          uVar4 = uVar4 & 0xffffffff;
          do {
            this->decoder_table[uVar4 + 1] = (int)uVar5 - 1;
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->data_symbols);
    }
    *this->decoder_table = 0;
    while ((uint)uVar4 <= this->table_size) {
      uVar4 = (ulong)((uint)uVar4 + 1);
      this->decoder_table[uVar4] = this->data_symbols - 1;
    }
  }
  uVar3 = this->update_cycle * 5 >> 2;
  uVar1 = this->data_symbols * 8 + 0x30;
  if (uVar1 <= uVar3) {
    uVar3 = uVar1;
  }
  this->update_cycle = uVar3;
  this->symbols_until_update = uVar3;
  return;
}

Assistant:

void Adaptive_Data_Model::update(bool from_encoder)
    {
                                       // halve counts when a threshold is reached

      if ((total_count += update_cycle) > DM__MaxCount) {
        total_count = 0;
        for (unsigned n = 0; n < data_symbols; n++)
          total_count += (symbol_count[n] = (symbol_count[n] + 1) >> 1);
      }
      assert(total_count > 0);
                                 // compute cumulative distribution, decoder table
      unsigned k, sum = 0, s = 0;
      unsigned scale = 0x80000000U / total_count;

      if (from_encoder || (table_size == 0))
        for (k = 0; k < data_symbols; k++) {
          distribution[k] = (scale * sum) >> (31 - DM__LengthShift);
          sum += symbol_count[k];
        }
      else {
        assert(decoder_table);
        for (k = 0; k < data_symbols; k++) {
          distribution[k] = (scale * sum) >> (31 - DM__LengthShift);
          sum += symbol_count[k];
          unsigned w = distribution[k] >> table_shift;
          while (s < w) decoder_table[++s] = k - 1;
        }
        decoder_table[0] = 0;
        while (s <= table_size) decoder_table[++s] = data_symbols - 1;
      }
                                                 // set frequency of model updates
      update_cycle = (5 * update_cycle) >> 2;
      unsigned max_cycle = (data_symbols + 6) << 3;
      if (update_cycle > max_cycle) update_cycle = max_cycle;
      symbols_until_update = update_cycle;
    }